

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

cs_err cs_open(cs_arch arch,cs_mode mode,csh *handle)

{
  cs_struct *pcVar1;
  cs_struct *ud;
  cs_err err;
  csh *handle_local;
  cs_mode mode_local;
  cs_arch arch_local;
  
  if ((((cs_mem_malloc == (cs_malloc_t)0x0) || (cs_mem_calloc == (cs_calloc_t)0x0)) ||
      (cs_mem_realloc == (cs_realloc_t)0x0)) ||
     ((cs_mem_free == (cs_free_t)0x0 || (cs_vsnprintf == (cs_vsnprintf_t)0x0)))) {
    mode_local = CS_MODE_64;
  }
  else {
    archs_enable();
    if ((arch < CS_ARCH_MAX) && (arch_init[arch] != (_func_cs_err_cs_struct_ptr *)0x0)) {
      pcVar1 = (cs_struct *)(*cs_mem_calloc)(1,0x128);
      if (pcVar1 == (cs_struct *)0x0) {
        mode_local = 1;
      }
      else {
        pcVar1->errnum = CS_ERR_OK;
        pcVar1->arch = arch;
        pcVar1->mode = mode;
        pcVar1->big_endian = (mode & CS_MODE_BIG_ENDIAN) != CS_MODE_ARM;
        pcVar1->detail = CS_OPT_OFF;
        (pcVar1->skipdata_setup).mnemonic = ".byte";
        mode_local = (*arch_init[pcVar1->arch])(pcVar1);
        if (mode_local == CS_ERR_OK) {
          *handle = (csh)pcVar1;
          mode_local = CS_MODE_ARM;
        }
        else {
          (*cs_mem_free)(pcVar1);
          *handle = 0;
        }
      }
    }
    else {
      *handle = 0;
      mode_local = CS_MODE_16;
    }
  }
  return mode_local;
}

Assistant:

CAPSTONE_EXPORT
cs_err cs_open(cs_arch arch, cs_mode mode, csh *handle)
{
	cs_err err;
	struct cs_struct *ud;
	if (!cs_mem_malloc || !cs_mem_calloc || !cs_mem_realloc || !cs_mem_free || !cs_vsnprintf)
		// Error: before cs_open(), dynamic memory management must be initialized
		// with cs_option(CS_OPT_MEM)
		return CS_ERR_MEMSETUP;

	archs_enable();

	if (arch < CS_ARCH_MAX && arch_init[arch]) {
		ud = cs_mem_calloc(1, sizeof(*ud));
		if (!ud) {
			// memory insufficient
			return CS_ERR_MEM;
		}

		ud->errnum = CS_ERR_OK;
		ud->arch = arch;
		ud->mode = mode;
		ud->big_endian = mode & CS_MODE_BIG_ENDIAN;
		// by default, do not break instruction into details
		ud->detail = CS_OPT_OFF;

		// default skipdata setup
		ud->skipdata_setup.mnemonic = SKIPDATA_MNEM;

		err = arch_init[ud->arch](ud);
		if (err) {
			cs_mem_free(ud);
			*handle = 0;
			return err;
		}

		*handle = (uintptr_t)ud;

		return CS_ERR_OK;
	} else {
		*handle = 0;
		return CS_ERR_ARCH;
	}
}